

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::OneofDescriptorProto::IsInitialized(OneofDescriptorProto *this)

{
  uint uVar1;
  OneofOptions *pOVar2;
  bool bVar3;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if (((uVar1 & 2) != 0) && (this->options_ == (OneofOptions *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x29ab);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if ((uVar1 & 2) == 0) {
LAB_003799aa:
    bVar3 = true;
  }
  else {
    pOVar2 = this->options_;
    bVar3 = internal::ExtensionSet::IsInitialized(&pOVar2->_extensions_);
    if (bVar3) {
      bVar3 = internal::AllAreInitialized<google::protobuf::UninterpretedOption>
                        (&pOVar2->uninterpreted_option_);
      if (bVar3) goto LAB_003799aa;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool OneofDescriptorProto::IsInitialized() const {
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}